

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

string * cmFileAPI::ComputeSuffixHash(string *__return_storage_ptr__,string *file)

{
  undefined1 local_28 [8];
  cmCryptoHash hasher;
  string *file_local;
  string *hash;
  
  hasher.CTX = (rhash_context *)file;
  cmCryptoHash::cmCryptoHash((cmCryptoHash *)local_28,AlgoSHA3_256);
  cmCryptoHash::HashFile(__return_storage_ptr__,(cmCryptoHash *)local_28,(string *)hasher.CTX);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,'\x14');
  cmCryptoHash::~cmCryptoHash((cmCryptoHash *)local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::ComputeSuffixHash(std::string const& file)
{
  cmCryptoHash hasher(cmCryptoHash::AlgoSHA3_256);
  std::string hash = hasher.HashFile(file);
  hash.resize(20, '0');
  return hash;
}